

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

Value * __thiscall
wabt::Decompiler::Get<(wabt::ExprType)22>
          (Value *__return_storage_ptr__,Decompiler *this,VarExpr<(wabt::ExprType)22> *ve)

{
  string_view name;
  string *psVar1;
  string_view local_68;
  string local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  psVar1 = Var::name_abi_cxx11_(&ve->var);
  name.data_ = (psVar1->_M_dataplus)._M_p;
  name.size_ = psVar1->_M_string_length;
  local_68 = VarName(this,name);
  string_view::operator_cast_to_string(&local_58,&local_68);
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_initialize<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
             &local_58,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->v,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_38);
  __return_storage_ptr__->precedence = Atomic;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_38);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

Value Get(const VarExpr<T>& ve) {
    return Value{{std::string(VarName(ve.var.name()))}, Precedence::Atomic};
  }